

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

Maybe<kj::ArrayPtr<const_unsigned_char>_> * __thiscall
kj::Exception::getDetail
          (Maybe<kj::ArrayPtr<const_unsigned_char>_> *__return_storage_ptr__,Exception *this,
          DetailTypeId typeId)

{
  uchar *puVar1;
  size_t sVar2;
  Detail *pDVar3;
  
  pDVar3 = (this->details).builder.ptr;
  while( true ) {
    if (pDVar3 == (this->details).builder.pos) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    if (pDVar3->id == typeId) break;
    pDVar3 = pDVar3 + 1;
  }
  puVar1 = (pDVar3->value).ptr;
  sVar2 = (pDVar3->value).size_;
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = puVar1;
  (__return_storage_ptr__->ptr).field_1.value.size_ = sVar2;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::ArrayPtr<const byte>> Exception::getDetail(DetailTypeId typeId) const {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      return detail.value.asPtr();
    }
  }
  return kj::none;
}